

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::indexInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,any *value)

{
  bool bVar1;
  int index;
  type_info *ptVar2;
  pair<int,_int> range;
  SelectionSet bs;
  SelectionSet local_48;
  SelectionSet local_30;
  
  createSelectionSets(&local_48,this);
  ptVar2 = std::any::type(value);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&int::typeinfo);
  if (bVar1) {
    index = std::any_cast<int>(value);
    if ((index < 0) ||
       ((int)((*(int *)&((local_48.bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_finish.super__Bit_iterator_base._M_p -
              *(int *)&((local_48.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._M_p) * 8 +
             ((local_48.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->bitset_).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset) <= index)) {
      invalidIndex(this,index);
      goto LAB_001c097c;
    }
    IndexFinder::find(&local_30,&this->indexFinder,index);
LAB_001c094b:
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
              (&local_48.bitsets_,&local_30);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_30.bitsets_);
  }
  else {
    ptVar2 = std::any::type(value);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&std::pair<int,int>::typeinfo);
    if (!bVar1) goto LAB_001c097c;
    range = std::any_cast<std::pair<int,int>>(value);
    if (-1 < range.first) {
      if (range.second <
          (int)((*(int *)&((local_48.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                *(int *)&((local_48.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p) * 8 +
               ((local_48.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start)->bitset_).
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_offset)) {
        IndexFinder::find(&local_30,&this->indexFinder,range.first,range.second);
        goto LAB_001c094b;
      }
    }
    invalidIndexRange(this,range);
  }
LAB_001c097c:
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_48);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_48.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::indexInstruction(const std::any& value) {
    SelectionSet bs = createSelectionSets();

    if (value.type() == typeid(int)) {
      int index = std::any_cast<int>(value);
      if (index < 0 ||
          index >= static_cast<int>(bs.bitsets_[STUNTDOUBLE].size())) {
        invalidIndex(index);
      } else {
        bs = indexFinder.find(index);
      }
    } else if (value.type() == typeid(std::pair<int, int>)) {
      std::pair<int, int> indexRange =
          std::any_cast<std::pair<int, int>>(value);
      assert(indexRange.first <= indexRange.second);
      if (indexRange.first < 0 ||
          indexRange.second >=
              static_cast<int>(bs.bitsets_[STUNTDOUBLE].size())) {
        invalidIndexRange(indexRange);
      } else {
        bs = indexFinder.find(indexRange.first, indexRange.second);
      }
    }

    return bs.parallelReduce();
  }